

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O1

T_INDEX __thiscall
Nova::Grid<float,_3>::Closest_Node(Grid<float,_3> *this,TV *X,int number_of_ghost_cells)

{
  int iVar1;
  int i;
  long lVar2;
  int in_ECX;
  int iVar3;
  undefined4 in_register_00000014;
  TV *value;
  T_INDEX TVar4;
  Vector<float,_3,_true> data_copy;
  T_INDEX index;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_2c;
  int local_24;
  int local_20 [6];
  
  local_38 = *(undefined8 *)CONCAT44(in_register_00000014,number_of_ghost_cells);
  local_30 = *(undefined4 *)((undefined8 *)CONCAT44(in_register_00000014,number_of_ghost_cells) + 1)
  ;
  lVar2 = 0;
  do {
    *(float *)((long)&local_38 + lVar2) =
         *(float *)((long)&local_38 + lVar2) - *(float *)((long)X[1]._data._M_elems + lVar2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  do {
    *(float *)((long)&local_38 + lVar2) =
         *(float *)((long)&local_38 + lVar2) * *(float *)((long)X[4]._data._M_elems + lVar2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  do {
    *(float *)((long)&local_38 + lVar2) = *(float *)((long)&local_38 + lVar2) + 1.5;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  do {
    *(int *)((long)&local_2c + lVar2 * 4) = (int)*(float *)((long)&local_38 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  Node_Indices((Grid<float,_3> *)X,in_ECX);
  (this->counts)._data._M_elems[2] = local_24;
  *(undefined8 *)(this->counts)._data._M_elems = local_2c;
  lVar2 = 0;
  do {
    iVar1 = (this->counts)._data._M_elems[lVar2];
    iVar3 = local_20[lVar2];
    if (local_20[lVar2] < iVar1) {
      iVar3 = iVar1;
    }
    (this->counts)._data._M_elems[lVar2] = iVar3;
    if (local_20[lVar2 + 3] < iVar3) {
      iVar3 = local_20[lVar2 + 3];
    }
    (this->counts)._data._M_elems[lVar2] = iVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  TVar4._data._M_elems[2] = iVar3;
  TVar4._data._M_elems._0_8_ = this;
  return (T_INDEX)TVar4._data._M_elems;
}

Assistant:

T_INDEX Closest_Node(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index((X-domain.min_corner)*one_over_dX+(T)1.5);
        return Node_Indices(number_of_ghost_cells).Clamp(index);
    }